

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O0

wchar_t output_byte(archive_write_filter *f,uchar c)

{
  long lVar1;
  int iVar2;
  undefined1 in_SIL;
  long in_RDI;
  wchar_t ret;
  private_data_conflict3 *state;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  void *buff;
  undefined7 in_stack_ffffffffffffffe8;
  
  buff = *(void **)(in_RDI + 0x40);
  lVar1 = *(long *)((long)buff + 0x65188);
  *(long *)((long)buff + 0x65188) = lVar1 + 1;
  *(undefined1 *)(*(long *)((long)buff + 0x65178) + lVar1) = in_SIL;
  *(long *)((long)buff + 8) = *(long *)((long)buff + 8) + 1;
  if (*(long *)((long)buff + 0x65180) == *(long *)((long)buff + 0x65188)) {
    iVar2 = __archive_write_filter
                      ((archive_write_filter *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),buff,
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (iVar2 != 0) {
      return L'\xffffffe2';
    }
    *(undefined8 *)((long)buff + 0x65188) = 0;
  }
  return L'\0';
}

Assistant:

static int
output_byte(struct archive_write_filter *f, unsigned char c)
{
	struct private_data *state = f->data;

	state->compressed[state->compressed_offset++] = c;
	++state->out_count;

	if (state->compressed_buffer_size == state->compressed_offset) {
		int ret = __archive_write_filter(f->next_filter,
		    state->compressed, state->compressed_buffer_size);
		if (ret != ARCHIVE_OK)
			return ARCHIVE_FATAL;
		state->compressed_offset = 0;
	}

	return ARCHIVE_OK;
}